

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
CustomUintFormatter<1,false>::Unser<HashVerifier<AutoFile>,AddrManImpl::Format>
          (CustomUintFormatter<1,_false> *this,HashVerifier<AutoFile> *s,Format *v)

{
  long lVar1;
  Span<unsigned_long> s_00;
  size_t in_RCX;
  undefined1 *in_RDX;
  HashVerifier<AutoFile> *in_RSI;
  long in_FS_OFFSET;
  Span<std::byte> SVar2;
  uint64_t raw;
  uint64_t uVar3;
  Span<std::byte> *in_stack_ffffffffffffffa8;
  unsigned_long *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 1;
  Span<unsigned_long>::Span<unsigned_long,_0>
            ((Span<unsigned_long> *)in_stack_ffffffffffffffa8,(unsigned_long *)in_RSI,1);
  s_00.m_size = (size_t)in_RDX;
  s_00.m_data = in_stack_ffffffffffffffb0;
  AsWritableBytes<unsigned_long>(s_00);
  SVar2 = Span<std::byte>::first(in_stack_ffffffffffffffa8,(size_t)in_RSI);
  HashVerifier<AutoFile>::read(in_RSI,(int)SVar2.m_data,(void *)SVar2.m_size,in_RCX);
  uVar3 = le64toh_internal(uVar3);
  *in_RDX = (char)uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, I& v)
    {
        using U = typename std::conditional<std::is_enum<I>::value, std::underlying_type<I>, std::common_type<I>>::type::type;
        static_assert(std::numeric_limits<U>::max() >= MAX && std::numeric_limits<U>::min() <= 0, "Assigned type too small");
        uint64_t raw = 0;
        if (BigEndian) {
            s.read(AsWritableBytes(Span{&raw, 1}).last(Bytes));
            v = static_cast<I>(be64toh_internal(raw));
        } else {
            s.read(AsWritableBytes(Span{&raw, 1}).first(Bytes));
            v = static_cast<I>(le64toh_internal(raw));
        }
    }